

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::DataManReader::DoGetDeferred
          (DataManReader *this,Variable<unsigned_int> *variable,uint32_t *data)

{
  int commRank;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Engine",&local_79);
  std::__cxx11::string::string((string *)&local_58,"DataManReader",&local_7a);
  std::__cxx11::string::string((string *)&local_78,"GetDeferred",&local_7b);
  commRank = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_38,&local_58,&local_78,&(variable->super_VariableBase).m_Name,0,commRank,5,
              this->m_Verbosity,INFO);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  GetDeferredCommon<unsigned_int>(this,variable,data);
  return;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}